

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::mark_begin_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::match(dynamic_xpression<boost::xpressive::detail::mark_begin_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *state)

{
  int iVar1;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  sub_match_impl *psVar3;
  char *pcVar4;
  int iVar5;
  
  pmVar2 = (this->next_).xpr_.px;
  iVar1 = *(int *)&(this->
                   super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).field_0xc;
  psVar3 = state->sub_matches_;
  pcVar4 = psVar3[iVar1].begin_._M_current;
  psVar3[iVar1].begin_._M_current = (state->cur_)._M_current;
  iVar5 = (*(pmVar2->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._vptr_matchable[2])(pmVar2);
  if (SUB41(iVar5,0) == false) {
    psVar3[iVar1].begin_._M_current = pcVar4;
  }
  return SUB41(iVar5,0);
}

Assistant:

void link(xpression_linker<Char> &linker) const
    {
        linker.accept(*static_cast<Matcher const *>(this), 0);
    }